

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O1

int onig_st_lookup(st_table *table,st_data_t key,st_data_t *value)

{
  st_table_entry *psVar1;
  uint uVar2;
  int iVar3;
  st_table_entry *psVar4;
  int iVar5;
  
  uVar2 = (*table->type->hash)(key);
  iVar5 = 0;
  psVar4 = table->bins[(ulong)uVar2 % (ulong)(uint)table->num_bins];
  if (psVar4 == (st_table_entry *)0x0) {
    psVar4 = (st_table_entry *)0x0;
    goto LAB_0012cd38;
  }
  if (psVar4->hash == uVar2) {
    if (psVar4->key == key) goto LAB_0012cd38;
    iVar3 = (*table->type->compare)(key,psVar4->key);
    if (iVar3 == 0) goto LAB_0012cd38;
  }
  while( true ) {
    psVar1 = psVar4->next;
    if (psVar1 == (st_table_entry *)0x0) break;
    if (psVar1->hash == uVar2) {
      if (psVar1->key == key) break;
      iVar3 = (*table->type->compare)(key,psVar1->key);
      if (iVar3 == 0) break;
    }
    psVar4 = psVar4->next;
  }
  psVar4 = psVar4->next;
LAB_0012cd38:
  if ((psVar4 != (st_table_entry *)0x0) && (iVar5 = 1, value != (st_data_t *)0x0)) {
    *value = psVar4->record;
  }
  return iVar5;
}

Assistant:

extern int
st_lookup(st_table* table, register st_data_t key, st_data_t* value)
{
  unsigned int hash_val, bin_pos;
  register st_table_entry *ptr;

  hash_val = do_hash(key, table);
  FIND_ENTRY(table, ptr, hash_val, bin_pos);

  if (ptr == 0) {
    return 0;
  }
  else {
    if (value != 0)  *value = ptr->record;
    return 1;
  }
}